

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O1

void chrono::collision::FuseMesh
               (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                *vertexIN,
               vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *triangleIN,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               *vertexOUT,
               vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *triangleOUT,
               double tol)

{
  int iVar1;
  pointer pCVar2;
  long lVar3;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *this;
  int iVar4;
  int iVar5;
  pointer pCVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ChVector<int> merged_triangle;
  value_type local_8c;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *local_80;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  pCVar2 = (vertexOUT->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((vertexOUT->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (vertexOUT->
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  pCVar6 = (triangleOUT->
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((triangleOUT->
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar6) {
    (triangleOUT->super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pCVar6;
  }
  pCVar6 = (triangleIN->
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((triangleIN->
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar6) {
    uVar7 = 0;
    uVar8 = 1;
    local_80 = triangleOUT;
    do {
      iVar1 = pCVar6[uVar7].m_data[0];
      pCVar2 = (vertexIN->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_48.m_data[0] = pCVar2[iVar1].m_data[0];
      local_48.m_data[1] = pCVar2[iVar1].m_data[1];
      local_48.m_data[2] = pCVar2[iVar1].m_data[2];
      iVar4 = GetIndex(&local_48,vertexOUT,tol);
      iVar1 = (triangleIN->
              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[1];
      pCVar2 = (vertexIN->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_60.m_data[0] = pCVar2[iVar1].m_data[0];
      local_60.m_data[1] = pCVar2[iVar1].m_data[1];
      local_60.m_data[2] = pCVar2[iVar1].m_data[2];
      iVar5 = GetIndex(&local_60,vertexOUT,tol);
      this = local_80;
      iVar1 = (triangleIN->
              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[2];
      pCVar2 = (vertexIN->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_78.m_data[0] = pCVar2[iVar1].m_data[0];
      local_78.m_data[1] = pCVar2[iVar1].m_data[1];
      local_78.m_data[2] = pCVar2[iVar1].m_data[2];
      local_8c.m_data[2] = GetIndex(&local_78,vertexOUT,tol);
      local_8c.m_data[0] = iVar4;
      local_8c.m_data[1] = iVar5;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                (this,&local_8c);
      pCVar6 = (triangleIN->
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(triangleIN->
                     super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6 >> 2) *
              -0x5555555555555555;
      bVar9 = uVar8 <= uVar7;
      lVar3 = uVar7 - uVar8;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9 && lVar3 != 0);
  }
  return;
}

Assistant:

void FuseMesh(std::vector<ChVector<double> >& vertexIN,
              std::vector<ChVector<int> >& triangleIN,
              std::vector<ChVector<double> >& vertexOUT,
              std::vector<ChVector<int> >& triangleOUT,
              double tol = 0.0) {
    vertexOUT.clear();
    triangleOUT.clear();
    for (unsigned int it = 0; it < triangleIN.size(); it++) {
        unsigned int i1 = GetIndex(vertexIN[triangleIN[it].x()], vertexOUT, tol);
        unsigned int i2 = GetIndex(vertexIN[triangleIN[it].y()], vertexOUT, tol);
        unsigned int i3 = GetIndex(vertexIN[triangleIN[it].z()], vertexOUT, tol);

        ChVector<int> merged_triangle(i1, i2, i3);

        triangleOUT.push_back(merged_triangle);
    }
}